

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::TrianglesTestInstance::generateTriangles
          (TrianglesTestInstance *this,int iteration,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData,
          vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
          *outTriangles)

{
  undefined8 uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  size_type sVar8;
  int local_46c;
  MessageBuilder local_468;
  int local_2e4;
  size_type sStack_2e0;
  int triangleNdx;
  MessageBuilder local_2c8;
  Vector<float,_4> local_148;
  Vector<float,_4> local_138;
  Vector<float,_4> local_128;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vector<float,_4> local_f8;
  Vector<float,_4> local_e8;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  Vector<float,_4> local_38;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  *local_28;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  *outTriangles_local;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *outData_local;
  TrianglesTestInstance *pTStack_10;
  int iteration_local;
  TrianglesTestInstance *this_local;
  
  local_28 = outTriangles;
  outTriangles_local =
       (vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        *)outData;
  outData_local._4_4_ = iteration;
  pTStack_10 = this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize(outData,6);
  if (outData_local._4_4_ == 0) {
    tcu::Vector<float,_4>::Vector(&local_38,0.2,0.8,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,0);
    *(undefined8 *)pvVar3->m_data = local_38.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_38.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_48,0.5,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,1);
    *(undefined8 *)pvVar3->m_data = local_48.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_48.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_58,0.5,0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,2);
    *(undefined8 *)pvVar3->m_data = local_58.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_58.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_68,-0.5,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,3);
    *(undefined8 *)pvVar3->m_data = local_68.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_68.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_78,-1.5,-0.4,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,4);
    *(undefined8 *)pvVar3->m_data = local_78.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_78.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_88,-0.4,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,5);
    *(undefined8 *)pvVar3->m_data = local_88.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_88.m_data._8_8_;
  }
  else if (outData_local._4_4_ == 1) {
    tcu::Vector<float,_4>::Vector(&local_98,-0.499,0.128,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,0);
    *(undefined8 *)pvVar3->m_data = local_98.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_98.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_a8,-0.501,-0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,1);
    *(undefined8 *)pvVar3->m_data = local_a8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_a8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_b8,0.11,-0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,2);
    *(undefined8 *)pvVar3->m_data = local_b8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_b8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_c8,0.11,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,3);
    *(undefined8 *)pvVar3->m_data = local_c8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_c8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_d8,0.88,0.9,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,4);
    *(undefined8 *)pvVar3->m_data = local_d8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_d8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_e8,0.4,1.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,5);
    *(undefined8 *)pvVar3->m_data = local_e8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_e8.m_data._8_8_;
  }
  else if (outData_local._4_4_ == 2) {
    tcu::Vector<float,_4>::Vector(&local_f8,-0.9,-0.3,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,0);
    *(undefined8 *)pvVar3->m_data = local_f8.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_f8.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_108,1.1,-0.9,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,1);
    *(undefined8 *)pvVar3->m_data = local_108.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_108.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_118,-1.1,-0.1,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,2);
    *(undefined8 *)pvVar3->m_data = local_118.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_118.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_128,-0.11,0.2,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,3);
    *(undefined8 *)pvVar3->m_data = local_128.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_128.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_138,0.88,0.7,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,4);
    *(undefined8 *)pvVar3->m_data = local_138.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_138.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_148,-0.4,0.4,0.0,1.0);
    pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        outTriangles_local,5);
    *(undefined8 *)pvVar3->m_data = local_148.m_data._0_8_;
    *(undefined8 *)(pvVar3->m_data + 2) = local_148.m_data._8_8_;
  }
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(local_28,2);
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,0);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[0].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[0].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  pvVar4->sharedEdge[0] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,1);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[1].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[1].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  pvVar4->sharedEdge[1] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,2);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[2].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[2].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,0);
  pvVar4->sharedEdge[2] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,3);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[0].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[0].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  pvVar4->sharedEdge[0] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,4);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[1].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[1].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  pvVar4->sharedEdge[1] = false;
  pvVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      outTriangles_local,5);
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  uVar1 = *(undefined8 *)(pvVar3->m_data + 2);
  *(undefined8 *)pvVar4->positions[2].m_data = *(undefined8 *)pvVar3->m_data;
  *(undefined8 *)(pvVar4->positions[2].m_data + 2) = uVar1;
  pvVar4 = std::
           vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
           ::operator[](local_28,1);
  pvVar4->sharedEdge[2] = false;
  pTVar5 = Context::getTestContext
                     ((this->super_BaseTriangleTestInstance).super_BaseRenderingTestInstance.
                      super_TestInstance.m_context);
  pTVar6 = tcu::TestContext::getLog(pTVar5);
  tcu::TestLog::operator<<(&local_2c8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar7 = tcu::MessageBuilder::operator<<(&local_2c8,(char (*) [11])"Rendering ");
  sStack_2e0 = std::
               vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ::size(local_28);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&stack0xfffffffffffffd20);
  pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])" triangle(s):");
  tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2c8);
  for (local_2e4 = 0; iVar2 = local_2e4,
      sVar8 = std::
              vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
              ::size(local_28), iVar2 < (int)sVar8; local_2e4 = local_2e4 + 1) {
    pTVar5 = Context::getTestContext
                       ((this->super_BaseTriangleTestInstance).super_BaseRenderingTestInstance.
                        super_TestInstance.m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_468,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_468,(char (*) [10])"Triangle ");
    local_46c = local_2e4 + 1;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_46c);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x137f180);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x13c5d9d);
    pvVar4 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[](local_28,(long)local_2e4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar4->positions);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x13c5d9d);
    pvVar4 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[](local_28,(long)local_2e4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar4->positions + 1);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x13c5d9d);
    pvVar4 = std::
             vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
             ::operator[](local_28,(long)local_2e4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,pvVar4->positions + 2);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_468);
  }
  return;
}

Assistant:

void TrianglesTestInstance::generateTriangles (int iteration, std::vector<tcu::Vec4>& outData, std::vector<TriangleSceneSpec::SceneTriangle>& outTriangles)
{
	outData.resize(6);

	switch (iteration)
	{
		case 0:
			// \note: these values are chosen arbitrarily
			outData[0] = tcu::Vec4( 0.2f,  0.8f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4( 0.5f,  0.2f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( 0.5f,  0.3f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.5f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(-1.5f, -0.4f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(-0.4f,  0.2f, 0.0f, 1.0f);
			break;

		case 1:
			outData[0] = tcu::Vec4(-0.499f, 0.128f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(-0.501f,  -0.3f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4(  0.11f,  -0.2f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(  0.11f,   0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4(  0.88f,   0.9f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4(   0.4f,   1.2f, 0.0f, 1.0f);
			break;

		case 2:
			outData[0] = tcu::Vec4( -0.9f, -0.3f, 0.0f, 1.0f);
			outData[1] = tcu::Vec4(  1.1f, -0.9f, 0.0f, 1.0f);
			outData[2] = tcu::Vec4( -1.1f, -0.1f, 0.0f, 1.0f);
			outData[3] = tcu::Vec4(-0.11f,  0.2f, 0.0f, 1.0f);
			outData[4] = tcu::Vec4( 0.88f,  0.7f, 0.0f, 1.0f);
			outData[5] = tcu::Vec4( -0.4f,  0.4f, 0.0f, 1.0f);
			break;
	}

	outTriangles.resize(2);
	outTriangles[0].positions[0] = outData[0];	outTriangles[0].sharedEdge[0] = false;
	outTriangles[0].positions[1] = outData[1];	outTriangles[0].sharedEdge[1] = false;
	outTriangles[0].positions[2] = outData[2];	outTriangles[0].sharedEdge[2] = false;

	outTriangles[1].positions[0] = outData[3];	outTriangles[1].sharedEdge[0] = false;
	outTriangles[1].positions[1] = outData[4];	outTriangles[1].sharedEdge[1] = false;
	outTriangles[1].positions[2] = outData[5];	outTriangles[1].sharedEdge[2] = false;

	// log
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Rendering " << outTriangles.size() << " triangle(s):" << tcu::TestLog::EndMessage;
	for (int triangleNdx = 0; triangleNdx < (int)outTriangles.size(); ++triangleNdx)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< "Triangle " << (triangleNdx+1) << ":"
			<< "\n\t" << outTriangles[triangleNdx].positions[0]
			<< "\n\t" << outTriangles[triangleNdx].positions[1]
			<< "\n\t" << outTriangles[triangleNdx].positions[2]
			<< tcu::TestLog::EndMessage;
	}
}